

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O3

void delete_program(Program *program)

{
  AST *ast;
  Source_File *src;
  Translation_Error *translation_error;
  Queue *pQVar1;
  
  pQVar1 = program->translation_units;
  while (pQVar1->size != 0) {
    ast = (AST *)Queue_Pop(pQVar1);
    delete_ast(ast);
    pQVar1 = program->translation_units;
  }
  free(pQVar1);
  while (pQVar1 = program->source_files, pQVar1->size != 0) {
    src = (Source_File *)Queue_Pop(pQVar1);
    delete_source_file(src);
  }
  free(pQVar1);
  while (pQVar1 = program->errors, pQVar1->size != 0) {
    translation_error = (Translation_Error *)Queue_Pop(pQVar1);
    delete_translation_error(translation_error);
  }
  free(pQVar1);
  delete_linkage(program->external_linkage);
  Map_Map(program->types,delete_type);
  Map_Destroy(program->types);
  free(program->types);
  free(program);
  return;
}

Assistant:

void delete_program(struct Program *program)
{
	while(program->translation_units->size>0)
		delete_ast(Queue_Pop(program->translation_units));
	free(program->translation_units);



	while(program->source_files->size>0)
		delete_source_file(Queue_Pop(program->source_files));
	free(program->source_files);


	while(program->errors->size>0)
		delete_translation_error(Queue_Pop(program->errors));
	free(program->errors);


	delete_linkage(program->external_linkage);

	/*BEWARE*/
	Map_Map(program->types,delete_type);
	Map_Destroy(program->types);
	free(program->types);

	free(program);

}